

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# server.cpp
# Opt level: O3

void server::updateBanner(void)

{
  uint uVar1;
  string text;
  stringformatter local_130;
  char local_128 [272];
  
  if (updateBanner()::lastshow == '\0') {
    updateBanner();
  }
  if ((0 < DAT_00194304) && (bannerintervolmillis <= lastmillis - updateBanner::lastshow)) {
    local_130.buf = local_128;
    uVar1 = randomMT();
    stringformatter::operator()
              (&local_130,"%s",
               *(undefined8 *)
                (banners + ((long)(ulong)(uVar1 & 0xffffff) % (long)DAT_00194304 & 0xffffffffU) * 8)
              );
    sendf(-1,1,"ris",0x23,local_128);
    updateBanner::lastshow = lastmillis;
  }
  return;
}

Assistant:

void updateBanner()
    {
        static int lastshow = lastmillis;
        if(banners.length() > 0)
        {
            if((lastmillis-lastshow) >= bannerintervolmillis)
            {
                defformatstring(text)("%s", banners[rnd(banners.length())]);
                sendservmsg(text);
                lastshow = lastmillis;
            } else return;
        }
    }